

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O0

int envy_bios_parse_rdcb(envy_bios *bios)

{
  uint uVar1;
  int local_2c;
  byte local_26;
  byte local_25;
  int j;
  uint8_t tv1;
  uint8_t tv0;
  envy_bios_dcb *peStack_20;
  int err;
  envy_bios_dcb *dcb;
  envy_bios *bios_local;
  
  peStack_20 = &bios->dcb;
  j = 0;
  dcb = (envy_bios_dcb *)bios;
  uVar1 = bios_u8(bios,peStack_20->offset - 1,&(bios->dcb).rdcb_version);
  j = uVar1 | j;
  if (j == 0) {
    uVar1 = (uint)peStack_20->rdcb_version;
    if (uVar1 == 0x11) {
      peStack_20->rdcb_len = 0xc;
    }
    else if (uVar1 - 0x15 < 2) {
      peStack_20->rdcb_len = 0x18;
    }
    else {
      if (uVar1 != 0x17) {
        fprintf(_stderr,"Unknown RDCB table version %d.%d\n",
                (ulong)(uint)((int)(uint)peStack_20->rdcb_version >> 4),
                (ulong)(peStack_20->rdcb_version & 0xf));
        return -0x16;
      }
      peStack_20->rdcb_len = 0x1c;
    }
    uVar1 = bios_u16((envy_bios *)dcb,peStack_20->offset - 3,(uint16_t *)&dcb[9].entries);
    j = uVar1 | j;
    uVar1 = bios_u8((envy_bios *)dcb,peStack_20->offset - 5,&local_25);
    j = uVar1 | j;
    uVar1 = bios_u8((envy_bios *)dcb,peStack_20->offset - 4,&local_26);
    j = uVar1 | j;
    peStack_20->tvdac0_present = local_25 & 1;
    peStack_20->tvdac0_neg = (byte)((int)(uint)local_25 >> 1) & 1;
    peStack_20->tvdac0_line = (uint8_t)((int)(uint)local_26 >> 4);
    peStack_20->rdcb_unk04_0 = local_26 & 0xf;
    peStack_20->rdcb_unk05_2 = (uint8_t)((int)(uint)local_25 >> 2);
    for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
      uVar1 = bios_u8((envy_bios *)dcb,(peStack_20->offset - 6) - local_2c,
                      peStack_20->rdcb_unk06 + local_2c);
      j = uVar1 | j;
    }
    if (0x14 < peStack_20->rdcb_version) {
      uVar1 = bios_u8((envy_bios *)dcb,peStack_20->offset - 0xd,&peStack_20->rdcb_unk0d);
      j = uVar1 | j;
      uVar1 = bios_u16((envy_bios *)dcb,peStack_20->offset - 0xf,(uint16_t *)&dcb[8].rdcb_unk05_2);
      j = uVar1 | j;
      for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
        uVar1 = bios_u8((envy_bios *)dcb,(peStack_20->offset - 0x10) - local_2c,
                        peStack_20->rdcb_unk10 + local_2c);
        j = uVar1 | j;
      }
    }
    if (0x16 < peStack_20->rdcb_version) {
      for (local_2c = 9; local_2c < 0xd; local_2c = local_2c + 1) {
        uVar1 = bios_u8((envy_bios *)dcb,(peStack_20->offset - 0x10) - local_2c,
                        peStack_20->rdcb_unk10 + local_2c);
        j = uVar1 | j;
      }
    }
    if (j == 0) {
      envy_bios_block((envy_bios *)dcb,(uint)peStack_20->offset - (uint)peStack_20->rdcb_len,
                      (uint)peStack_20->rdcb_len,"RDCB",-1);
      if (peStack_20->rdcb_version < 0x16) {
        *(uint *)(dcb[6].rdcb_unk10 + 3) =
             ((uint)peStack_20->offset - (uint)peStack_20->rdcb_len) + -0x80;
        envy_bios_block((envy_bios *)dcb,*(uint *)(dcb[6].rdcb_unk10 + 3),0x80,"ODCB",-1);
      }
      peStack_20->rdcb_valid = '\x01';
      bios_local._4_4_ = 0;
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  else {
    bios_local._4_4_ = -0xe;
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_rdcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	int err = 0;
	err |= bios_u8(bios, dcb->offset - 1, &dcb->rdcb_version);
	if (err)
		return -EFAULT;
	switch (dcb->rdcb_version) {
		case 0x11:
			dcb->rdcb_len = 0xc;
			break;
		case 0x15:
		case 0x16:
			dcb->rdcb_len = 0x18;
			break;
		case 0x17:
			dcb->rdcb_len = 0x1c;
			break;
		default:
			ENVY_BIOS_ERR("Unknown RDCB table version %d.%d\n", dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
			return -EINVAL;
	}
	err |= bios_u16(bios, dcb->offset - 3, &bios->inputdev.offset);
	uint8_t tv0, tv1;
	int j;
	err |= bios_u8(bios, dcb->offset - 5, &tv0);
	err |= bios_u8(bios, dcb->offset - 4, &tv1);
	dcb->tvdac0_present = tv0 & 1;
	dcb->tvdac0_neg = tv0 >> 1 & 1;
	dcb->tvdac0_line = tv1 >> 4;
	dcb->rdcb_unk04_0 = tv1 & 0xf;
	dcb->rdcb_unk05_2 = tv0 >> 2;
	for (j = 0; j < 7; j++)
		err |= bios_u8(bios, dcb->offset - 6 - j, &dcb->rdcb_unk06[j]);
	if (dcb->rdcb_version >= 0x15) {
		err |= bios_u8(bios, dcb->offset - 13, &dcb->rdcb_unk0d);
		err |= bios_u16(bios, dcb->offset - 15, &bios->gpio.offset);
		for (j = 0; j < 9; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (dcb->rdcb_version >= 0x17) {
		for (j = 9; j < 13; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, "RDCB", -1);
	if (dcb->rdcb_version < 0x16) {
		bios->odcb_offset = dcb->offset - dcb->rdcb_len - 0x80;
		envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
	}
	dcb->rdcb_valid = 1;
	return 0;
}